

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<_IO_FILE*>(ExtIsoForest *model,_IO_FILE **in)

{
  pointer pvVar1;
  IsoHPlane *node;
  IsoHPlane *node_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree;
  pointer this;
  IsoHPlane *pIVar2;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t veclen;
  uint8_t data_en [5];
  size_t data_sizets [2];
  double data_doubles [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  size_type local_68;
  ushort local_5e;
  byte local_5c;
  char local_5b;
  byte local_5a;
  size_t local_58;
  size_type local_50;
  double local_48;
  double dStack_40;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_char>(&local_5e,5,in);
    uVar3 = (ulong)CONCAT14((char)(local_5e >> 8),(uint)(local_5e & 0xff));
    model->new_cat_action = (int)uVar3;
    model->cat_split_type = (int)(uVar3 >> 0x20);
    model->missing_action = (uint)local_5c;
    model->has_range_penalty = local_5b != '\0';
    model->scoring_metric = (uint)local_5a;
    read_bytes<double>(&local_48,2,in);
    model->exp_avg_depth = local_48;
    model->exp_avg_sep = dStack_40;
    read_bytes<unsigned_long>(&local_58,2,in);
    model->orig_sample_size = local_58;
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize(&model->hplanes,local_50);
    pvVar1 = (model->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pvVar1 != (model->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>,_true>
      ::_S_do_it(&model->hplanes);
      pvVar1 = (model->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (model->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (this != pvVar1) {
      do {
        read_bytes<unsigned_long>(&local_68,1,in);
        std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize(this,local_68);
        pIVar2 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (pIVar2 != (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_true>::
          _S_do_it(this);
          pIVar2 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        for (node_00 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start; node_00 != pIVar2; node_00 = node_00 + 1) {
          deserialize_node<_IO_FILE*>(node_00,in,&local_88);
        }
        this = this + 1;
      } while (this != pvVar1);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en[5];
    read_bytes<uint8_t>((void*)data_en, (size_t)5, in);
    model.new_cat_action = (NewCategAction)data_en[0];
    model.cat_split_type = (CategSplit)data_en[1];
    model.missing_action = (MissingAction)data_en[2];
    model.has_range_penalty = (bool)data_en[3];
    model.scoring_metric = (ScoringMetric)data_en[4];

    double data_doubles[2];
    read_bytes<double>((void*)data_doubles, (size_t)2, in);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t>((void*)data_sizets, (size_t)2, in);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t>((void*)&veclen, (size_t)1, in);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node(node, in, buffer);
    }
}